

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O2

void PrintInfoOnTarget(Component *c)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *d;
  pointer pbVar4;
  char *pcVar5;
  __node_base *p_Var6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sortedPrivDeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sortedPubDeps;
  
  if (c != (Component *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Root: ");
    poVar1 = std::operator<<(poVar1,(string *)c);
    std::operator<<(poVar1,'\n');
    poVar1 = std::operator<<((ostream *)&std::cout,"Name: ");
    poVar1 = std::operator<<(poVar1,(c->name)._M_dataplus._M_p);
    std::operator<<(poVar1,'\n');
    poVar1 = std::operator<<((ostream *)&std::cout,"Type: ");
    poVar1 = std::operator<<(poVar1,(c->type)._M_dataplus._M_p);
    std::operator<<(poVar1,'\n');
    poVar1 = std::operator<<((ostream *)&std::cout,"Lines of Code: ");
    Component::loc(c);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,'\n');
    poVar1 = std::operator<<((ostream *)&std::cout,"Recreate: ");
    pcVar5 = "false";
    pcVar3 = "false";
    if (c->recreate != false) {
      pcVar3 = "true";
    }
    poVar1 = std::operator<<(poVar1,pcVar3);
    std::operator<<(poVar1,'\n');
    poVar1 = std::operator<<((ostream *)&std::cout,"Has CMakeAddon.txt: ");
    if (c->hasAddonCmake != false) {
      pcVar5 = "true";
    }
    poVar1 = std::operator<<(poVar1,pcVar5);
    std::operator<<(poVar1,'\n');
    SortedNiceNames_abi_cxx11_(&sortedPubDeps,&c->pubDeps);
    poVar1 = std::operator<<((ostream *)&std::cout,"Public dependencies (");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"): ");
    for (pbVar4 = sortedPubDeps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 != sortedPubDeps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
      poVar1 = std::operator<<((ostream *)&std::cout,' ');
      std::operator<<(poVar1,(string *)pbVar4);
    }
    SortedNiceNames_abi_cxx11_(&sortedPrivDeps,&c->privDeps);
    poVar1 = std::operator<<((ostream *)&std::cout,"\nPrivate dependencies (");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"): ");
    for (pbVar4 = sortedPrivDeps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 != sortedPrivDeps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
      poVar1 = std::operator<<((ostream *)&std::cout,' ');
      std::operator<<(poVar1,(string *)pbVar4);
    }
    std::operator<<((ostream *)&std::cout,"\nBuild-afters:");
    for (p_Var2 = (c->buildAfters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(c->buildAfters)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      poVar1 = std::operator<<((ostream *)&std::cout,' ');
      std::operator<<(poVar1,(string *)(p_Var2 + 1));
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"\nFiles (");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"):");
    p_Var6 = &(c->files)._M_h._M_before_begin;
    while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
      poVar1 = std::operator<<((ostream *)&std::cout,' ');
      std::operator<<(poVar1,(string *)p_Var6[1]._M_nxt);
    }
    std::operator<<((ostream *)&std::cout,'\n');
    PrintLinksForTarget(c);
    std::operator<<((ostream *)&std::cout,'\n');
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&sortedPrivDeps);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&sortedPubDeps);
    return;
  }
  std::operator<<((ostream *)&std::cout,"Component does not exist (double-check spelling)\n");
  return;
}

Assistant:

void PrintInfoOnTarget(Component *c) {
    if (!c) {
        std::cout << "Component does not exist (double-check spelling)\n";
        return;
    }
    std::cout << "Root: " << c->root.string() << '\n';
    std::cout << "Name: " << c->name.c_str() << '\n';
    std::cout << "Type: " << c->type.c_str() << '\n';
    std::cout << "Lines of Code: " << c->loc() << '\n';
    std::cout << "Recreate: " << (c->recreate ? "true" : "false") << '\n';
    std::cout << "Has CMakeAddon.txt: " << (c->hasAddonCmake ? "true" : "false") << '\n';

    std::vector<std::string> sortedPubDeps(SortedNiceNames(c->pubDeps));
    std::cout << "Public dependencies (" << sortedPubDeps.size() << "): ";
    for (auto &d : sortedPubDeps) {
        std::cout << ' ' << d;
    }
    std::vector<std::string> sortedPrivDeps(SortedNiceNames(c->privDeps));
    std::cout << "\nPrivate dependencies (" << sortedPrivDeps.size() << "): ";
    for (auto &d : sortedPrivDeps) {
        std::cout << ' ' << d;
    }
    std::cout << "\nBuild-afters:";
    for (auto &d : c->buildAfters) {
        std::cout << ' ' << d;
    }
    std::cout << "\nFiles (" << c->files.size() << "):";
    for (auto &d : c->files) {
        std::cout << ' ' << d->path.string();
    }
    std::cout << '\n';
    PrintLinksForTarget(c);
    std::cout << '\n';
}